

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

Var Js::JavascriptMath::Not_InPlace
              (Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  undefined4 *puVar6;
  RecyclableObject *this;
  Var pvVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  uVar8 = (ulong)aRight & 0xffff000000000000;
  bVar9 = uVar8 != 0x1000000000000;
  bVar10 = ((ulong)aRight & 0x1ffff00000000) == 0x1000000000000;
  if (bVar10 || bVar9) {
    if (uVar8 == 0x1000000000000) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      goto LAB_00a9a5cb;
    }
    if (aRight == (Var)0x0) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      goto LAB_00a9a689;
    }
    if ((ulong)aRight >> 0x32 == 0) goto LAB_00a9a6ce;
LAB_00a9a8b9:
    uVar5 = JavascriptConversion::ToInt32_Full(aRight,scriptContext);
    aRight = (Var)(ulong)uVar5;
    goto LAB_00a9a887;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar6 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                              ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                              "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
  if (!bVar3) goto LAB_00a9a8d1;
  *puVar6 = 0;
LAB_00a9a5cb:
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  *puVar6 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                              ,0x42,"(!TaggedInt::Is(aRight))","Should be detected");
  if (!bVar3) goto LAB_00a9a8d1;
  *puVar6 = 0;
  if (aRight == (Var)0x0) {
LAB_00a9a689:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a9a8d1;
    *puVar6 = 0;
LAB_00a9a6ce:
    this = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00a9a8d1;
      *puVar6 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_BigInt) {
        pvVar7 = JavascriptBigInt::Not(aRight);
        return pvVar7;
      }
    }
    else {
      BVar4 = RecyclableObject::IsExternal(this);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_00a9a8d1;
        *puVar6 = 0;
      }
    }
    if (!bVar10 && !bVar9) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      goto LAB_00a9a7d8;
    }
    if (uVar8 != 0x1000000000000) goto LAB_00a9a8b9;
  }
  else if (!bVar10 && !bVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar6 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar9) goto LAB_00a9a8d1;
    *puVar6 = 0;
LAB_00a9a7d8:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar6 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar9) goto LAB_00a9a8d1;
    *puVar6 = 0;
  }
  if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar9) {
LAB_00a9a8d1:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
LAB_00a9a887:
  pvVar7 = JavascriptNumber::ToVarInPlace(~(uint)aRight,scriptContext,result);
  return pvVar7;
}

Assistant:

Var JavascriptMath::Not_InPlace(Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_NotInPlace);
            AssertMsg(!TaggedInt::Is(aRight), "Should be detected");

            if (JavascriptOperators::GetTypeId(aRight) == TypeIds_BigInt)
            {
                return JavascriptBigInt::Not(aRight);
            }

            int nValue = JavascriptConversion::ToInt32(aRight, scriptContext);
            return JavascriptNumber::ToVarInPlace(~nValue, scriptContext, result);
            JIT_HELPER_END(Op_NotInPlace);
        }